

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_Ssl.cpp
# Opt level: O0

int __thiscall axl::io::Ssl::shutdown(Ssl *this,int __fd,int __how)

{
  uint uVar1;
  ulong extraout_RAX;
  int in_stack_0000000c;
  Ssl *in_stack_00000010;
  int result;
  ulong uVar2;
  
  uVar1 = SSL_shutdown((SSL *)(this->
                              super_Handle<ssl_st_*,_axl::io::FreeSsl,_axl::sl::Zero<ssl_st_*>_>).
                              m_h);
  uVar2 = (ulong)uVar1;
  if (-1 >= (int)uVar1) {
    setError(in_stack_00000010,in_stack_0000000c);
    uVar2 = extraout_RAX;
  }
  return (int)CONCAT71((int7)(uVar2 >> 8),-1 < (int)uVar1);
}

Assistant:

bool
Ssl::shutdown() {
	ASSERT(m_h);

	int result = ::SSL_shutdown(m_h);
	if (result < 0) { // 0 here means shutdown in progress
		setError(result);
		return false;
	}

	return true;
}